

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __node_base _Var4;
  _Node_iterator_base<std::pair<const_int,_double>,_false> _Var5;
  long lVar6;
  __node_base *p_Var7;
  pointer pdVar8;
  __node_base _Var9;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  pair<std::__detail::_Node_const_iterator<std::pair<const_int,_double>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_int,_double>,_false,_false>_>
  pVar10;
  undefined1 local_22e;
  undefined1 local_22d;
  undefined1 local_22c;
  allocator_type local_22b;
  allocator_type local_22a;
  allocator_type local_229;
  _Vector_base<double,_std::allocator<double>_> local_228;
  _Vector_base<double,_std::allocator<double>_> local_208;
  _Vector_base<double,_std::allocator<double>_> local_1e8;
  undefined1 local_1c8 [16];
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  _Hash_node_base *local_1a8;
  vector<double,_std::allocator<double>_> test;
  function<int_(double)> func;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  output;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  grouped;
  double local_d0;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> keys;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  expectedGroupBy;
  double local_58 [5];
  
  output._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x4000000000000000;
  output._M_h._M_element_count = 0x4002666666666666;
  output._M_h._M_buckets = (__buckets_ptr)0x3ff0000000000000;
  output._M_h._M_bucket_count = 0x3ff3333333333333;
  output._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  output._M_h._M_rehash_policy._4_4_ = 0x40080000;
  __l._M_len = 5;
  __l._M_array = (iterator)&output;
  std::vector<double,_std::allocator<double>_>::vector(&test,__l,(allocator_type *)&keys);
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  func._M_invoker =
       std::
       _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp:13:33)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp:13:33)>
       ::_M_manager;
  poVar3 = std::operator<<((ostream *)&std::cout,"Test groupBy...");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_58[2] = 1.0;
  local_58[3] = 1.2;
  __l_00._M_len = 2;
  __l_00._M_array = local_58 + 2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_228,__l_00,&local_229);
  output._M_h._M_element_count =
       (size_type)local_228._M_impl.super__Vector_impl_data._M_end_of_storage;
  output._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)local_228._M_impl.super__Vector_impl_data._M_finish;
  output._M_h._M_bucket_count = (size_type)local_228._M_impl.super__Vector_impl_data._M_start;
  keys._M_h._M_buckets = (__buckets_ptr)CONCAT44(keys._M_h._M_buckets._4_4_,1);
  local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output._M_h._M_buckets = (__buckets_ptr)CONCAT44(output._M_h._M_buckets._4_4_,1);
  keys._M_h._M_element_count = 0;
  keys._M_h._M_bucket_count = 0;
  keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58[0] = 2.0;
  local_58[1] = 2.3;
  __l_01._M_len = 2;
  __l_01._M_array = local_58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_208,__l_01,&local_22a);
  output._M_h._M_single_bucket =
       (__node_base_ptr)local_208._M_impl.super__Vector_impl_data._M_finish;
  output._M_h._M_rehash_policy._M_next_resize =
       (size_t)local_208._M_impl.super__Vector_impl_data._M_start;
  grouped._M_h._M_buckets = (__buckets_ptr)CONCAT44(grouped._M_h._M_buckets._4_4_,2);
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output._M_h._M_rehash_policy._M_max_load_factor = 2.8026e-45;
  grouped._M_h._M_element_count = 0;
  grouped._M_h._M_bucket_count = 0;
  grouped._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d0 = 3.0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_d0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1e8,__l_02,&local_22b);
  local_1c8._0_4_ = 3;
  local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._8_8_ = (__node_type *)0x0;
  uStack_1b8 = 0;
  local_1b0 = 0;
  std::
  _Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<int_const,std::vector<double,std::allocator<double>>>const*>
            ((_Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&expectedGroupBy,&output,&grouped,0,&local_22c,&local_22d,&local_22e);
  lVar6 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)&output._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x18);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(local_1c8 + 8));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&grouped._M_h._M_bucket_count);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_208);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&keys._M_h._M_bucket_count);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_228);
  grouped._M_h._M_buckets = &grouped._M_h._M_single_bucket;
  grouped._M_h._M_bucket_count = 1;
  grouped._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  grouped._M_h._M_element_count = 0;
  grouped._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  grouped._M_h._M_rehash_policy._M_next_resize = 0;
  grouped._M_h._M_single_bucket = (__node_base_ptr)0x0;
  output._M_h._M_buckets = &output._M_h._M_single_bucket;
  output._M_h._M_bucket_count = 1;
  output._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  output._M_h._M_element_count = 0;
  output._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  output._M_h._M_rehash_policy._M_next_resize = 0;
  output._M_h._M_single_bucket = (__node_base_ptr)0x0;
  keys._M_h._M_bucket_count = 0;
  keys._M_h._M_buckets = (__buckets_ptr)&output;
  for (pdVar8 = test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 != test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
    iVar2 = std::function<int_(double)>::operator()(&func,*pdVar8);
    local_1c8._8_8_ = *pdVar8;
    local_1c8._0_4_ = iVar2;
    std::
    insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
    ::operator=((insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                 *)&keys,(value_type *)local_1c8);
  }
  keys._M_h._M_buckets = &keys._M_h._M_single_bucket;
  keys._M_h._M_bucket_count = 1;
  keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  keys._M_h._M_element_count = 0;
  keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  keys._M_h._M_rehash_policy._M_next_resize = 0;
  keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1c8._8_8_ = (__node_type *)0x0;
  local_1c8._0_8_ =
       (insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
        *)&keys;
  for (_Var9._M_nxt = output._M_h._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
    local_228._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_228._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(undefined4 *)&_Var9._M_nxt[1]._M_nxt);
    std::
    insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
    ::operator=((insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
                 *)local_1c8,(value_type *)&local_228);
  }
  _Var4._M_nxt = keys._M_h._M_before_begin._M_nxt;
  while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
    local_1a8 = _Var4._M_nxt;
    pVar10 = std::
             _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             ::equal_range(&output._M_h,(key_type *)(_Var4._M_nxt + 1));
    local_1c8._0_8_ =
         (insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
          *)0x0;
    local_1c8._8_8_ = (__node_type *)0x0;
    uStack_1b8 = 0;
    local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
    for (_Var5._M_cur = (__node_type *)
                        pVar10.first.super__Node_iterator_base<std::pair<const_int,_double>,_false>.
                        _M_cur;
        (_Node_iterator_base<std::pair<const_int,_double>,_false>)_Var5._M_cur !=
        pVar10.second.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur.
        super__Node_iterator_base<std::pair<const_int,_double>,_false>;
        _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
      local_208._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)&((_Var5._M_cur)->super__Hash_node_value<std::pair<const_int,_double>,_false>).
                    super__Hash_node_value_base<std::pair<const_int,_double>_>._M_storage._M_storage
            + 8);
      std::insert_iterator<std::vector<double,_std::allocator<double>_>_>::operator=
                ((insert_iterator<std::vector<double,_std::allocator<double>_>_> *)&local_228,
                 (value_type_conflict *)&local_208);
    }
    std::
    _Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int_const&,std::vector<double,std::allocator<double>>&>
              ((_Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&grouped,_Var4._M_nxt + 1,
               (insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
                *)local_1c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_1c8);
    _Var4._M_nxt = local_1a8->_M_nxt;
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&keys._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&output._M_h);
  p_Var7 = &grouped._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    std::
    __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
               p_Var7[3]._M_nxt);
  }
  p_Var7 = &expectedGroupBy._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    std::
    __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor,
               p_Var7[3]._M_nxt);
  }
  bVar1 = std::__detail::
          _Equality<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&expectedGroupBy,&grouped._M_h);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&grouped._M_h);
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&expectedGroupBy._M_h);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&test.super__Vector_base<double,_std::allocator<double>_>);
    return 0;
  }
  __assert_fail("expectedGroupBy==grouped",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp"
                ,0x1e,"int main()");
}

Assistant:

int main(){
     
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  
  cout << "Test groupBy..." << endl;
  unordered_map<int, vector<double> > expectedGroupBy={
      make_pair(1, vector<double>{1.0, 1.2}),      
      make_pair(2, vector<double>{2.0, 2.3}),      
      make_pair(3, vector<double>{3.0})      
  };
  auto grouped = Functional::groupBy(test, func);  
  
  for( auto & kv : grouped ){
      sort(kv.second.begin(), kv.second.end());
  }  
  for( auto & kv : expectedGroupBy ){
      sort(kv.second.begin(), kv.second.end());
  }
  
  assert(expectedGroupBy==grouped);
  cout << "passed!" << endl;
  
  return 0;

}